

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Integrator
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string *this_00;
  string lss;
  allocator<char> local_14a;
  allocator<char> local_149;
  vector<int,_std::allocator<int>_> iterations;
  string local_128;
  string extra;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX);
  ParameterDictionary::ParameterDictionary(&dict,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  bVar2 = this->upgrade;
  if ((bool)bVar2 == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lss,"rrthreshold",(allocator<char> *)&iterations);
    ParameterDictionary::RemoveFloat(&dict,&lss);
    std::__cxx11::string::~string((string *)&lss);
    bVar1 = std::operator==(name,"sppm");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lss,"imagewritefrequency",(allocator<char> *)&iterations);
      ParameterDictionary::RemoveInt(&dict,&lss);
      std::__cxx11::string::~string((string *)&lss);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lss,"numiterations",(allocator<char> *)&local_128);
      ParameterDictionary::GetIntArray(&iterations,&dict,&lss);
      std::__cxx11::string::~string((string *)&lss);
      if (iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lss,"numiterations",(allocator<char> *)&local_128);
        ParameterDictionary::RemoveInt(&dict,&lss);
        std::__cxx11::string::~string((string *)&lss);
        Warning((FileLoc *)&params,
                "The SPPM integrator no longer takes a \"numiterations\" parameter. This value is now set via the Sampler\'s number of pixel samples."
               );
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&iterations.super__Vector_base<int,_std::allocator<int>_>);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iterations,"lightsamplestrategy",&local_149);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_14a);
    ParameterDictionary::GetOneString(&lss,&dict,(string *)&iterations,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&iterations);
    bVar1 = std::operator==(&lss,"spatial");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&iterations,"lightsamplestrategy",(allocator<char> *)&local_128);
      ParameterDictionary::RemoveString(&dict,(string *)&iterations);
      std::__cxx11::string::~string((string *)&iterations);
      indent_abi_cxx11_(&local_128,this,1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &iterations,&local_128,"\"string lightsamplestrategy\" \"bvh\"\n");
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&iterations);
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::__cxx11::string::~string((string *)&lss);
    bVar2 = this->upgrade;
  }
  if ((bVar2 & 1) != 0) {
    bVar1 = std::operator==(name,"directlighting");
    if (bVar1) {
      indent_abi_cxx11_(&lss,this,0);
      Printf<std::__cxx11::string>("%sIntegrator \"path\"\n",&lss);
      std::__cxx11::string::~string((string *)&lss);
      indent_abi_cxx11_((string *)&iterations,this,1);
      std::operator+(&lss,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &iterations,"\"integer maxdepth\" [ 1 ]\n");
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&lss);
      this_00 = (string *)&iterations;
      goto LAB_0037ba81;
    }
  }
  indent_abi_cxx11_(&lss,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sIntegrator \"%s\"\n",&lss,name);
  this_00 = &lss;
LAB_0037ba81:
  std::__cxx11::string::~string((string *)this_00);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&lss,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar3,(string *)&lss);
  std::__cxx11::string::~string((string *)&lss);
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::Integrator(const std::string &name, ParsedParameterVector params,
                                 FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        dict.RemoveFloat("rrthreshold");

        if (name == "sppm") {
            dict.RemoveInt("imagewritefrequency");

            std::vector<int> iterations = dict.GetIntArray("numiterations");
            if (!iterations.empty()) {
                dict.RemoveInt("numiterations");
                Warning(
                    &loc,
                    "The SPPM integrator no longer takes a \"numiterations\" parameter. "
                    "This value is now set via the Sampler's number of pixel samples.");
            }
        }
        std::string lss = dict.GetOneString("lightsamplestrategy", "");
        if (lss == "spatial") {
            dict.RemoveString("lightsamplestrategy");
            extra += indent(1) + "\"string lightsamplestrategy\" \"bvh\"\n";
        }
    }

    if (upgrade && name == "directlighting") {
        Printf("%sIntegrator \"path\"\n", indent());
        extra += indent(1) + "\"integer maxdepth\" [ 1 ]\n";
    } else
        Printf("%sIntegrator \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}